

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpConnection.cpp
# Opt level: O0

ssize_t __thiscall
Liby::UdpConnection::send(UdpConnection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  ssize_t extraout_RAX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  function<void_()> local_70;
  shared_ptr<Liby::Buffer> local_50;
  undefined1 local_40 [8];
  udp_io_task utask;
  BasicHandler *handler_local;
  char *buf_local;
  UdpConnection *this_local;
  
  handler_local = (BasicHandler *)CONCAT44(in_register_00000034,__fd);
  utask.handler_._M_t.
  super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>._M_t.
  super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>.
  super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::function<void_()>,_std::default_delete<std::function<void_()>_>,_true,_true>
        )(__uniq_ptr_data<std::function<void_()>,_std::default_delete<std::function<void_()>_>,_true,_true>
          )__buf;
  buf_local = (char *)this;
  if (this->socket_ == (UdpSocket *)0x0) {
    __assert_fail("socket_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/UdpConnection.cpp"
                  ,0x2a,"void Liby::UdpConnection::send(const char *, const BasicHandler &)");
  }
  udp_io_task::udp_io_task((udp_io_task *)local_40);
  local_70._M_invoker = (_Invoker_type)strlen((char *)handler_local);
  std::make_shared<Liby::Buffer,char_const*&,unsigned_long>
            ((char **)&local_50,(unsigned_long *)&handler_local);
  std::shared_ptr<Liby::Buffer>::operator=((shared_ptr<Liby::Buffer> *)&utask,&local_50);
  std::shared_ptr<Liby::Buffer>::~shared_ptr(&local_50);
  local_40 = (undefined1  [8])&this->peer_;
  bVar1 = std::function::operator_cast_to_bool
                    ((function *)
                     utask.handler_._M_t.
                     super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>
                     .super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl);
  __buf_00 = extraout_RDX;
  if (bVar1) {
    std::make_unique<std::function<void()>,std::function<void()>const&>(&local_70);
    std::unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>::
    operator=((unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_> *)
              &utask.buffer_.super___shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount,
              (unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_> *)
              &local_70);
    std::unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>::
    ~unique_ptr((unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_> *
                )&local_70);
    __buf_00 = extraout_RDX_00;
  }
  UdpSocket::send(this->socket_,(int)local_40,__buf_00,__n,__flags);
  udp_io_task::~udp_io_task((udp_io_task *)local_40);
  return extraout_RAX;
}

Assistant:

void UdpConnection::send(const char *buf, const BasicHandler &handler) {
    assert(socket_);
    udp_io_task utask;
    utask.buffer_ = std::make_shared<Buffer>(buf, ::strlen(buf));
    utask.dest_ = &peer_;
    if (handler) {
        utask.handler_ = std::make_unique<BasicHandler>(handler);
    }
    socket_->send(std::move(utask));
}